

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O0

void av1_count_colors_highbd
               (uint8_t *src8,int stride,int rows,int cols,int bit_depth,int *val_count,
               int *bin_val_count,int *num_color_bins,int *num_colors)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  ulong uVar3;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  byte in_R8B;
  void *in_R9;
  int i_1;
  int i;
  int n;
  int this_val;
  int c;
  int r;
  uint16_t *src;
  int max_pix_val;
  int max_bin_val;
  int local_48;
  int local_44;
  int local_40;
  int local_38;
  int local_34;
  
  iVar1 = 1 << (in_R8B & 0x1f);
  memset(_n,0,0x400);
  if (in_R9 != (void *)0x0) {
    memset(in_R9,0,(long)iVar1 << 2);
  }
  for (local_34 = 0; local_34 < in_EDX; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < in_ECX; local_38 = local_38 + 1) {
      iVar2 = (int)(uint)*(ushort *)(in_RDI * 2 + (long)(local_34 * in_ESI + local_38) * 2) >>
              (in_R8B - 8 & 0x1f);
      if ((iVar2 < 0x100) &&
         (*(int *)((long)_n + (long)iVar2 * 4) = *(int *)((long)_n + (long)iVar2 * 4) + 1,
         in_R9 != (void *)0x0)) {
        uVar3 = (ulong)*(ushort *)(in_RDI * 2 + (long)(local_34 * in_ESI + local_38) * 2);
        *(int *)((long)in_R9 + uVar3 * 4) = *(int *)((long)in_R9 + uVar3 * 4) + 1;
      }
    }
  }
  local_40 = 0;
  for (local_44 = 0; local_44 < 0x100; local_44 = local_44 + 1) {
    if (*(int *)((long)_n + (long)local_44 * 4) != 0) {
      local_40 = local_40 + 1;
    }
  }
  *_c = local_40;
  local_40 = 0;
  if (in_R9 != (void *)0x0) {
    for (local_48 = 0; local_48 < iVar1; local_48 = local_48 + 1) {
      if (*(int *)((long)in_R9 + (long)local_48 * 4) != 0) {
        local_40 = local_40 + 1;
      }
    }
    *(int *)src = local_40;
  }
  return;
}

Assistant:

void av1_count_colors_highbd(const uint8_t *src8, int stride, int rows,
                             int cols, int bit_depth, int *val_count,
                             int *bin_val_count, int *num_color_bins,
                             int *num_colors) {
  assert(bit_depth <= 12);
  const int max_bin_val = 1 << 8;
  const int max_pix_val = 1 << bit_depth;
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  memset(bin_val_count, 0, max_bin_val * sizeof(val_count[0]));
  if (val_count != NULL)
    memset(val_count, 0, max_pix_val * sizeof(val_count[0]));
  for (int r = 0; r < rows; ++r) {
    for (int c = 0; c < cols; ++c) {
      /*
       * Down-convert the pixels to 8-bit domain before counting.
       * This provides consistency of behavior for palette search
       * between lbd and hbd encodes. This down-converted pixels
       * are only used for calculating the threshold (n).
       */
      const int this_val = ((src[r * stride + c]) >> (bit_depth - 8));
      assert(this_val < max_bin_val);
      if (this_val >= max_bin_val) continue;
      ++bin_val_count[this_val];
      if (val_count != NULL) ++val_count[(src[r * stride + c])];
    }
  }
  int n = 0;
  // Count the colors based on 8-bit domain used to gate the palette path
  for (int i = 0; i < max_bin_val; ++i) {
    if (bin_val_count[i]) ++n;
  }
  *num_color_bins = n;

  // Count the actual hbd colors used to create top_colors
  n = 0;
  if (val_count != NULL) {
    for (int i = 0; i < max_pix_val; ++i) {
      if (val_count[i]) ++n;
    }
    *num_colors = n;
  }
}